

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

Item * Lib::List<Inferences::URResolution::Item_*>::pop
                 (List<Inferences::URResolution::Item_*> **lst)

{
  List<Inferences::URResolution::Item_*> *ptr;
  Item *pIVar1;
  List<Inferences::URResolution::Item_*> *pLVar2;
  
  ptr = *lst;
  pIVar1 = ptr->_head;
  pLVar2 = ptr->_tail;
  List<Inferences::URResolution::Item*>::operator_delete(ptr,0x10);
  *lst = pLVar2;
  return pIVar1;
}

Assistant:

static C pop(List* &lst)
  {
    ASS_NEQ(lst,0);

    List* tail = lst->tail();
    C result = lst->head();
    delete lst;
    lst = tail;

    return result;
  }